

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qxkbcommon.cpp
# Opt level: O3

QString * QXkbCommon::lookupStringNoKeysymTransformations
                    (QString *__return_storage_ptr__,xkb_keysym_t keysym)

{
  int iVar1;
  storage_type *psVar2;
  int iVar3;
  ulong aalloc;
  ulong asize;
  long in_FS_OFFSET;
  QByteArrayView QVar4;
  QVLABase<char> local_70;
  char local_58 [32];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_58[0x10] = -0x56;
  local_58[0x11] = -0x56;
  local_58[0x12] = -0x56;
  local_58[0x13] = -0x56;
  local_58[0x14] = -0x56;
  local_58[0x15] = -0x56;
  local_58[0x16] = -0x56;
  local_58[0x17] = -0x56;
  local_58[0x18] = -0x56;
  local_58[0x19] = -0x56;
  local_58[0x1a] = -0x56;
  local_58[0x1b] = -0x56;
  local_58[0x1c] = -0x56;
  local_58[0x1d] = -0x56;
  local_58[0x1e] = -0x56;
  local_58[0x1f] = -0x56;
  local_58[0] = -0x56;
  local_58[1] = -0x56;
  local_58[2] = -0x56;
  local_58[3] = -0x56;
  local_58[4] = -0x56;
  local_58[5] = -0x56;
  local_58[6] = -0x56;
  local_58[7] = -0x56;
  local_58[8] = -0x56;
  local_58[9] = -0x56;
  local_58[10] = -0x56;
  local_58[0xb] = -0x56;
  local_58[0xc] = -0x56;
  local_58[0xd] = -0x56;
  local_58[0xe] = -0x56;
  local_58[0xf] = -0x56;
  local_70.super_QVLABaseBase.a = 0x20;
  local_70.super_QVLABaseBase.s = 0x20;
  local_70.super_QVLABaseBase.ptr = local_58;
  iVar1 = xkb_keysym_to_utf8(keysym,local_58,0x20);
  if (iVar1 == 0) {
    (__return_storage_ptr__->d).d = (Data *)0x0;
    (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
    (__return_storage_ptr__->d).size = 0;
  }
  else {
    asize = (ulong)iVar1;
    if (local_70.super_QVLABaseBase.s < (long)asize) {
      aalloc = local_70.super_QVLABaseBase.a;
      if (local_70.super_QVLABaseBase.a <= (long)asize) {
        aalloc = asize;
      }
      QVLABase<char>::reallocate_impl(&local_70,0x20,local_58,asize,aalloc);
      local_70.super_QVLABaseBase.s = asize;
      xkb_keysym_to_utf8(keysym,local_70.super_QVLABaseBase.ptr,asize);
    }
    iVar3 = 1;
    if (1 < iVar1) {
      iVar3 = iVar1;
    }
    psVar2 = (storage_type *)(ulong)(iVar3 - 1);
    if ((char *)local_70.super_QVLABaseBase.ptr == (char *)0x0) {
      psVar2 = (storage_type *)0x0;
    }
    if ((char *)local_70.super_QVLABaseBase.ptr != (char *)0x0 && iVar1 < 1) {
      psVar2 = (storage_type *)strlen((char *)local_70.super_QVLABaseBase.ptr);
    }
    QVar4.m_data = psVar2;
    QVar4.m_size = (qsizetype)__return_storage_ptr__;
    QString::fromUtf8(QVar4);
  }
  if ((char *)local_70.super_QVLABaseBase.ptr != local_58) {
    QtPrivate::sizedFree(local_70.super_QVLABaseBase.ptr,local_70.super_QVLABaseBase.a);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QString QXkbCommon::lookupStringNoKeysymTransformations(xkb_keysym_t keysym)
{
    QVarLengthArray<char, 32> chars(32);
    const int size = xkb_keysym_to_utf8(keysym, chars.data(), chars.size());
    if (size == 0)
        return QString(); // the keysym does not have a Unicode representation

    if (Q_UNLIKELY(size > chars.size())) {
        chars.resize(size);
        xkb_keysym_to_utf8(keysym, chars.data(), chars.size());
    }
    return QString::fromUtf8(chars.constData(), size - 1);
}